

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O1

void nni_posix_pollq_sysfini(void)

{
  nni_posix_pollq *pnVar1;
  undefined8 in_RAX;
  ssize_t sVar2;
  long lVar3;
  long lVar4;
  nni_mtx *mtx;
  undefined8 local_38;
  
  if (0 < nni_epoll_npq) {
    local_38 = in_RAX;
    if (0 < nni_epoll_npq) {
      lVar3 = 0x70;
      lVar4 = 0;
      do {
        pnVar1 = nni_epoll_pqs;
        local_38 = 1;
        if (*(char *)((long)nni_epoll_pqs + lVar3 + -7) == '\x01') {
          mtx = (nni_mtx *)((long)nni_epoll_pqs + lVar3 + -0x70);
          nni_mtx_lock(mtx);
          *(undefined1 *)((long)pnVar1 + lVar3 + -8) = 1;
          sVar2 = write(*(int *)((long)pnVar1 + lVar3 + -0xc),&local_38,8);
          if (sVar2 != 8) {
            nni_panic("BUG! unable to write to evfd!");
          }
          nni_mtx_unlock(mtx);
          nni_thr_fini((nni_thr *)((long)&(pnVar1->mtx).mtx + lVar3));
          close(*(int *)((long)pnVar1 + lVar3 + -0xc));
          close(*(int *)((long)pnVar1 + lVar3 + -0x10));
          nni_mtx_fini(mtx);
        }
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0x120;
      } while (lVar4 < nni_epoll_npq);
    }
    nni_free(nni_epoll_pqs,(long)nni_epoll_npq * 0x120);
    nni_epoll_pqs = (nni_posix_pollq *)0x0;
    nni_epoll_npq = 0;
  }
  return;
}

Assistant:

void
nni_posix_pollq_sysfini(void)
{
	if (nni_epoll_npq > 0) {
		for (int i = 0; i < nni_epoll_npq; i++) {
			nni_epoll_pq_destroy(&nni_epoll_pqs[i]);
		}
		NNI_FREE_STRUCTS(nni_epoll_pqs, nni_epoll_npq);
		nni_epoll_pqs = NULL;
		nni_epoll_npq = 0;
	}
}